

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::object_literal_expression,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>
          (parser *this,
          vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_> *args)

{
  position_stack_node *this_00;
  element_type *this_01;
  property_name_and_value_list *in_RDX;
  source_extend local_40;
  
  this_00 = (position_stack_node *)
            args[4].
            super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != (position_stack_node *)0x0) {
    this_01 = (element_type *)operator_new(0x38);
    position_stack_node::extend(&local_40,this_00);
    object_literal_expression::object_literal_expression
              ((object_literal_expression *)this_01,&local_40,in_RDX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("expression_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x13d,
                "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::object_literal_expression, Args = <std::vector<mjs::property_name_and_value>>]"
               );
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }